

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(InternalMetadata *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  if ((this->ptr_ & 1U) == 0) {
    pbVar1 = mutable_unknown_fields_slow<std::__cxx11::string>(this);
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((this->ptr_ & 0xfffffffffffffffcU) + 8);
  }
  pbVar1->_M_string_length = 0;
  *(pbVar1->_M_dataplus)._M_p = '\0';
  return;
}

Assistant:

void InternalMetadata::DoClear<std::string>() {
  mutable_unknown_fields<std::string>()->clear();
}